

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

void MiniScript::UnitTest::RunAllTests(void)

{
  long *plVar1;
  
  for (plVar1 = &cTests; plVar1 = (long *)*plVar1, plVar1 != (long *)0x0; plVar1 = plVar1 + 2) {
    (**(code **)(*plVar1 + 8))(plVar1);
    (**(code **)*plVar1)(plVar1);
    (**(code **)(*plVar1 + 0x10))(plVar1);
  }
  return;
}

Assistant:

void UnitTest::RunAllTests()
	{
		for (UnitTest *test = cTests; test; test = test->mNext) {
//			std::cout << "Running " << test->name << std::endl;
			test->SetUp();
			test->Run();
			test->TearDown();
//			std::cout << "StringStorage instances left: " << StringStorage::instanceCount << std::endl;
//			std::cout << "total RefCountedStorage instances left: " << RefCountedStorage::instanceCount << std::endl;
		}
	}